

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa.cc
# Opt level: O0

bool __thiscall
re2::DFA::Search(DFA *this,StringPiece *text,StringPiece *context,bool anchored,
                bool want_earliest_match,bool run_forward,bool *failed,char **epp,
                vector<int,_std::allocator<int>_> *matches)

{
  bool bVar1;
  iterator pcVar2;
  bool ret;
  undefined1 local_98 [8];
  SearchParams params;
  RWLocker l;
  bool run_forward_local;
  bool want_earliest_match_local;
  bool anchored_local;
  StringPiece *context_local;
  StringPiece *text_local;
  DFA *this_local;
  
  *epp = (char *)0x0;
  bVar1 = ok(this);
  if (bVar1) {
    *failed = false;
    RWLocker::RWLocker((RWLocker *)&params.matches,&this->cache_mutex_);
    SearchParams::SearchParams((SearchParams *)local_98,text,context,(RWLocker *)&params.matches);
    params.ep = (char *)matches;
    params.context.length_._0_1_ = anchored;
    params.context.length_._1_1_ = want_earliest_match;
    params.context.length_._2_1_ = run_forward;
    bVar1 = AnalyzeSearch(this,(SearchParams *)local_98);
    if (bVar1) {
      if (params._32_8_ == 1) {
        this_local._7_1_ = false;
      }
      else if (params._32_8_ == 2) {
        if (run_forward == want_earliest_match) {
          pcVar2 = StringPiece::begin(text);
          *epp = pcVar2;
        }
        else {
          pcVar2 = StringPiece::end(text);
          *epp = pcVar2;
        }
        this_local._7_1_ = true;
      }
      else {
        this_local._7_1_ = FastSearchLoop(this,(SearchParams *)local_98);
        if (((byte)params.cache_lock & 1) == 0) {
          *epp = (char *)params._64_8_;
        }
        else {
          *failed = true;
          this_local._7_1_ = false;
        }
      }
    }
    else {
      *failed = true;
      this_local._7_1_ = false;
    }
    RWLocker::~RWLocker((RWLocker *)&params.matches);
  }
  else {
    *failed = true;
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool DFA::Search(const StringPiece& text,
                 const StringPiece& context,
                 bool anchored,
                 bool want_earliest_match,
                 bool run_forward,
                 bool* failed,
                 const char** epp,
                 vector<int>* matches) {
  *epp = NULL;
  if (!ok()) {
    *failed = true;
    return false;
  }
  *failed = false;

  if (DebugDFA) {
    fprintf(stderr, "\nprogram:\n%s\n", prog_->DumpUnanchored().c_str());
    fprintf(stderr, "text %s anchored=%d earliest=%d fwd=%d kind %d\n",
            text.as_string().c_str(), anchored, want_earliest_match,
            run_forward, kind_);
  }

  RWLocker l(&cache_mutex_);
  SearchParams params(text, context, &l);
  params.anchored = anchored;
  params.want_earliest_match = want_earliest_match;
  params.run_forward = run_forward;
  params.matches = matches;

  if (!AnalyzeSearch(&params)) {
    *failed = true;
    return false;
  }
  if (params.start == DeadState)
    return false;
  if (params.start == FullMatchState) {
    if (run_forward == want_earliest_match)
      *epp = text.begin();
    else
      *epp = text.end();
    return true;
  }
  if (DebugDFA)
    fprintf(stderr, "start %s\n", DumpState(params.start).c_str());
  bool ret = FastSearchLoop(&params);
  if (params.failed) {
    *failed = true;
    return false;
  }
  *epp = params.ep;
  return ret;
}